

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O3

PCF_Property pcf_find_property(PCF_Face face,FT_String *prop)

{
  PCF_Property pPVar1;
  int iVar2;
  int iVar3;
  PCF_Property pPVar4;
  ulong uVar5;
  
  iVar2 = face->nprops;
  if (0 < (long)iVar2) {
    pPVar4 = face->properties + -1;
    uVar5 = 1;
    do {
      pPVar1 = pPVar4 + 1;
      pPVar4 = pPVar4 + 1;
      iVar3 = strcmp(pPVar1->name,prop);
      if ((ulong)(long)iVar2 <= uVar5) break;
      uVar5 = uVar5 + 1;
    } while (iVar3 != 0);
    if (iVar3 == 0) {
      return pPVar4;
    }
  }
  return (PCF_Property)0x0;
}

Assistant:

FT_LOCAL_DEF( PCF_Property )
  pcf_find_property( PCF_Face          face,
                     const FT_String*  prop )
  {
    PCF_Property  properties = face->properties;
    FT_Bool       found      = 0;
    int           i;


    for ( i = 0; i < face->nprops && !found; i++ )
    {
      if ( !ft_strcmp( properties[i].name, prop ) )
        found = 1;
    }

    if ( found )
      return properties + i - 1;
    else
      return NULL;
  }